

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O0

void __thiscall
Eigen::internal::
gemm_pack_rhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_1,_false,_false>
::operator()(gemm_pack_rhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_1,_false,_false>
             *this,double *blockB,const_blas_data_mapper<double,_long,_1> *rhs,long depth,long cols,
            long stride,long offset)

{
  bool bVar1;
  double *pdVar2;
  double *pdVar3;
  long local_120;
  long k_1;
  long j2_1;
  LinearMapper dm0;
  long k;
  long j2;
  long count;
  long packet_cols4;
  long packet_cols8;
  long lStack_d8;
  conj_if<false> cj;
  long stride_local;
  long cols_local;
  long depth_local;
  const_blas_data_mapper<double,_long,_1> *rhs_local;
  double *blockB_local;
  gemm_pack_rhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_1,_false,_false>
  *this_local;
  undefined1 local_50 [8];
  double *local_48;
  undefined1 *local_40;
  long local_38;
  double *local_30;
  const_blas_data_mapper<double,_long,_1> *local_28;
  long local_20;
  long local_18;
  const_blas_data_mapper<double,_long,_1> *local_10;
  
  lStack_d8 = stride;
  ignore_unused_variable<long>(&stack0xffffffffffffff28);
  ignore_unused_variable<long>(&offset);
  if ((lStack_d8 != 0) || (bVar1 = true, offset != 0)) {
    bVar1 = false;
  }
  if (bVar1) {
    k_1 = cols / 4 << 2;
    j2 = 0;
    for (k = 0; k < k_1; k = k + 4) {
      for (dm0.m_data = (double *)0x0; (long)dm0.m_data < depth; dm0.m_data = dm0.m_data + 1) {
        local_30 = dm0.m_data;
        local_38 = k;
        pdVar3 = (rhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data +
                 k + (long)dm0.m_data *
                     (rhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_stride;
        local_40 = local_50;
        local_48 = pdVar3;
        local_28 = rhs;
        pdVar2 = conj_if<false>::operator()((conj_if<false> *)((long)&packet_cols8 + 7),pdVar3);
        blockB[j2] = *pdVar2;
        pdVar2 = conj_if<false>::operator()((conj_if<false> *)((long)&packet_cols8 + 7),pdVar3 + 1);
        blockB[j2 + 1] = *pdVar2;
        pdVar2 = conj_if<false>::operator()((conj_if<false> *)((long)&packet_cols8 + 7),pdVar3 + 2);
        blockB[j2 + 2] = *pdVar2;
        pdVar3 = conj_if<false>::operator()((conj_if<false> *)((long)&packet_cols8 + 7),pdVar3 + 3);
        blockB[j2 + 3] = *pdVar3;
        j2 = j2 + 4;
      }
    }
    for (; k_1 < cols; k_1 = k_1 + 1) {
      for (local_120 = 0; local_120 < depth; local_120 = local_120 + 1) {
        local_18 = local_120;
        local_20 = k_1;
        local_10 = rhs;
        pdVar3 = conj_if<false>::operator()
                           ((conj_if<false> *)((long)&packet_cols8 + 7),
                            (rhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data +
                            k_1 + local_120 *
                                  (rhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_stride);
        blockB[j2] = *pdVar3;
        j2 = j2 + 1;
      }
    }
    return;
  }
  __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                ,0x7f5,
                "void Eigen::internal::gemm_pack_rhs<double, long, Eigen::internal::const_blas_data_mapper<double, long, 1>, 4, 1>::operator()(Scalar *, const DataMapper &, Index, Index, Index, Index) [Scalar = double, Index = long, DataMapper = Eigen::internal::const_blas_data_mapper<double, long, 1>, nr = 4, StorageOrder = 1, Conjugate = false, PanelMode = false]"
               );
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_rhs<Scalar, Index, DataMapper, nr, RowMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockB, const DataMapper& rhs, Index depth, Index cols, Index stride, Index offset)
{
  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK RHS ROWMAJOR");
  EIGEN_UNUSED_VARIABLE(stride);
  EIGEN_UNUSED_VARIABLE(offset);
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index packet_cols8 = nr>=8 ? (cols/8) * 8 : 0;
  Index packet_cols4 = nr>=4 ? (cols/4) * 4 : 0;
  Index count = 0;

//   if(nr>=8)
//   {
//     for(Index j2=0; j2<packet_cols8; j2+=8)
//     {
//       // skip what we have before
//       if(PanelMode) count += 8 * offset;
//       for(Index k=0; k<depth; k++)
//       {
//         if (PacketSize==8) {
//           Packet A = ploadu<Packet>(&rhs[k*rhsStride + j2]);
//           pstoreu(blockB+count, cj.pconj(A));
//         } else if (PacketSize==4) {
//           Packet A = ploadu<Packet>(&rhs[k*rhsStride + j2]);
//           Packet B = ploadu<Packet>(&rhs[k*rhsStride + j2 + PacketSize]);
//           pstoreu(blockB+count, cj.pconj(A));
//           pstoreu(blockB+count+PacketSize, cj.pconj(B));
//         } else {
//           const Scalar* b0 = &rhs[k*rhsStride + j2];
//           blockB[count+0] = cj(b0[0]);
//           blockB[count+1] = cj(b0[1]);
//           blockB[count+2] = cj(b0[2]);
//           blockB[count+3] = cj(b0[3]);
//           blockB[count+4] = cj(b0[4]);
//           blockB[count+5] = cj(b0[5]);
//           blockB[count+6] = cj(b0[6]);
//           blockB[count+7] = cj(b0[7]);
//         }
//         count += 8;
//       }
//       // skip what we have after
//       if(PanelMode) count += 8 * (stride-offset-depth);
//     }
//   }
  if(nr>=4)
  {
    for(Index j2=packet_cols8; j2<packet_cols4; j2+=4)
    {
      // skip what we have before
      if(PanelMode) count += 4 * offset;
      for(Index k=0; k<depth; k++)
      {
        if (PacketSize==4) {
          Packet A = rhs.loadPacket(k, j2);
          pstoreu(blockB+count, cj.pconj(A));
          count += PacketSize;
        } else {
          const LinearMapper dm0 = rhs.getLinearMapper(k, j2);
          blockB[count+0] = cj(dm0(0));
          blockB[count+1] = cj(dm0(1));
          blockB[count+2] = cj(dm0(2));
          blockB[count+3] = cj(dm0(3));
          count += 4;
        }
      }
      // skip what we have after
      if(PanelMode) count += 4 * (stride-offset-depth);
    }
  }
  // copy the remaining columns one at a time (nr==1)
  for(Index j2=packet_cols4; j2<cols; ++j2)
  {
    if(PanelMode) count += offset;
    for(Index k=0; k<depth; k++)
    {
      blockB[count] = cj(rhs(k, j2));
      count += 1;
    }
    if(PanelMode) count += stride-offset-depth;
  }
}